

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O1

addr_type __thiscall
ExportDirWrapper::containsAddrType(ExportDirWrapper *this,size_t fieldId,size_t subField)

{
  addr_type aVar1;
  
  aVar1 = NOT_ADDR;
  if (fieldId - 4 < 7) {
    aVar1 = *(addr_type *)("18ExportEntryWrapper" + fieldId * 4 + 5);
  }
  return aVar1;
}

Assistant:

Executable::addr_type ExportDirWrapper::containsAddrType(size_t fieldId, size_t subField)
{
    switch (fieldId) {
        case NAME_RVA:
        case FUNCTIONS_RVA:
        case FUNC_NAMES_RVA:
        case NAMES_ORDINALS_RVA:
            return Executable::RVA;
    }
    return Executable::NOT_ADDR;
}